

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O0

void PositionOrphanInterval(CostManager *manager,CostInterval *current,CostInterval *previous)

{
  bool bVar1;
  CostInterval *in_RDX;
  CostInterval *in_RSI;
  CostManager *in_RDI;
  CostInterval *local_18;
  
  local_18 = in_RDX;
  if (in_RDX == (CostInterval *)0x0) {
    local_18 = in_RDI->head_;
  }
  while( true ) {
    bVar1 = false;
    if (local_18 != (CostInterval *)0x0) {
      bVar1 = in_RSI->start_ < local_18->start_;
    }
    if (!bVar1) break;
    local_18 = local_18->previous_;
  }
  while( true ) {
    bVar1 = false;
    if ((local_18 != (CostInterval *)0x0) && (bVar1 = false, local_18->next_ != (CostInterval *)0x0)
       ) {
      bVar1 = local_18->next_->start_ < in_RSI->start_;
    }
    if (!bVar1) break;
    local_18 = local_18->next_;
  }
  if (local_18 == (CostInterval *)0x0) {
    ConnectIntervals(in_RDI,in_RSI,in_RDI->head_);
  }
  else {
    ConnectIntervals(in_RDI,in_RSI,local_18->next_);
  }
  ConnectIntervals(in_RDI,local_18,in_RSI);
  return;
}

Assistant:

static WEBP_INLINE void PositionOrphanInterval(CostManager* const manager,
                                               CostInterval* const current,
                                               CostInterval* previous) {
  assert(current != NULL);

  if (previous == NULL) previous = manager->head_;
  while (previous != NULL && current->start_ < previous->start_) {
    previous = previous->previous_;
  }
  while (previous != NULL && previous->next_ != NULL &&
         previous->next_->start_ < current->start_) {
    previous = previous->next_;
  }

  if (previous != NULL) {
    ConnectIntervals(manager, current, previous->next_);
  } else {
    ConnectIntervals(manager, current, manager->head_);
  }
  ConnectIntervals(manager, previous, current);
}